

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  float fVar1;
  uint32_t uVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  DecalInstance di;
  undefined1 local_c8 [32];
  pointer local_a8;
  pointer pvStack_a0;
  pointer local_98;
  pointer pfStack_90;
  pointer local_88;
  pointer pfStack_80;
  pointer local_78;
  pointer pPStack_70;
  pointer local_68;
  undefined8 uStack_60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_c8._8_8_ = (pointer)0x0;
  local_68 = (pointer)0x0;
  uStack_60._0_4_ = NORMAL;
  uStack_60._4_4_ = 0;
  local_78 = (pointer)0x0;
  pPStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pfStack_80 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pfStack_90 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pvStack_a0 = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  local_c8._24_8_ = (pointer)0x0;
  local_c8._0_8_ = decal;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_c8 + 8),4);
  local_50 = 0;
  uStack_48 = 0x3f80000000000000;
  local_40 = 0x3f800000;
  uStack_3c = 0x3f800000;
  uStack_38 = 0x3f800000;
  uStack_34 = 0;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&local_a8,
             &local_50);
  local_50 = 0x3f8000003f800000;
  uStack_48 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&pfStack_90,&local_50);
  uVar2 = (tint->field_0).n;
  local_50 = CONCAT44(uVar2,uVar2);
  uStack_48 = CONCAT44(uVar2,uVar2);
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&local_78,&local_50);
  uStack_60._4_4_ = 4;
  fVar7 = center->y;
  fVar8 = scale->y;
  *(float *)local_c8._8_8_ = (0.0 - center->x) * scale->x;
  *(float *)(local_c8._8_8_ + 4) = (0.0 - fVar7) * fVar8;
  iVar3 = decal->sprite->height;
  fVar7 = center->y;
  fVar8 = scale->y;
  ((pointer)(local_c8._8_8_ + 8))->x = (0.0 - center->x) * scale->x;
  ((pointer)(local_c8._8_8_ + 8))->y = ((float)iVar3 - fVar7) * fVar8;
  iVar3 = decal->sprite->height;
  fVar7 = center->y;
  fVar8 = scale->y;
  ((pointer)(local_c8._8_8_ + 0x10))->x = ((float)decal->sprite->width - center->x) * scale->x;
  ((pointer)(local_c8._8_8_ + 0x10))->y = ((float)iVar3 - fVar7) * fVar8;
  fVar7 = center->y;
  fVar8 = scale->y;
  ((pointer)(local_c8._8_8_ + 0x18))->x = ((float)decal->sprite->width - center->x) * scale->x;
  ((pointer)(local_c8._8_8_ + 0x18))->y = (0.0 - fVar7) * fVar8;
  dVar4 = cos((double)fAngle);
  dVar5 = sin((double)fAngle);
  lVar6 = 0;
  do {
    fVar7 = *(float *)((long)(float *)local_c8._8_8_ + lVar6 * 2);
    fVar8 = *(float *)((long)(local_c8._8_8_ + 4) + lVar6 * 2);
    fVar1 = pos->y;
    *(float *)((long)(float *)local_c8._8_8_ + lVar6 * 2) =
         (fVar7 * (float)dVar4 - (float)dVar5 * fVar8) + pos->x;
    *(float *)((long)(local_c8._8_8_ + 4) + lVar6 * 2) =
         fVar7 * (float)dVar5 + fVar8 * (float)dVar4 + fVar1;
    fVar7 = *(float *)((long)(float *)local_c8._8_8_ + lVar6 * 2) * (this->vInvScreenSize).x;
    fVar8 = *(float *)((long)(local_c8._8_8_ + 4) + lVar6 * 2) * (this->vInvScreenSize).y;
    *(float *)((long)(float *)local_c8._8_8_ + lVar6 * 2) = fVar7 + fVar7 + -1.0;
    *(float *)((long)(local_c8._8_8_ + 4) + lVar6 * 2) = fVar8 + fVar8 + -1.0;
    *(uint *)((long)(local_c8._8_8_ + 4) + lVar6 * 2) =
         *(uint *)((long)(local_c8._8_8_ + 4) + lVar6 * 2) ^ 0x80000000;
    *(undefined4 *)((long)pfStack_90 + lVar6) = 0x3f800000;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x10);
  uStack_60._0_4_ = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_c8);
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (pfStack_90 != (pointer)0x0) {
    operator_delete(pfStack_90,(long)pfStack_80 - (long)pfStack_90);
  }
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_c8._24_8_ - local_c8._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawRotatedDecal(const olc::vf2d& pos, olc::Decal* decal, const float fAngle, const olc::vf2d& center, const olc::vf2d& scale, const olc::Pixel& tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(4);
		di.uv = { { 0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f} };
		di.w = { 1, 1, 1, 1 };
		di.tint = { tint, tint, tint, tint };
		di.points = 4;
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, float(decal->sprite->height)) - center) * scale;
		di.pos[2] = (olc::vf2d(float(decal->sprite->width), float(decal->sprite->height)) - center) * scale;
		di.pos[3] = (olc::vf2d(float(decal->sprite->width), 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
			di.w[i] = 1;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}